

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::AddField(UnknownFieldSet *this,UnknownField *field)

{
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  anon_union_8_5_912831f5_for_data_ aVar1;
  uint32 uVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  iterator __position;
  
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    pvVar3 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)operator_new(0x18);
    (pvVar3->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar3->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar3->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->fields_ = pvVar3;
  }
  this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *
            )this->fields_;
  __position._M_current = *(UnknownField **)(this_00 + 8);
  if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,field);
  }
  else {
    uVar2 = field->type_;
    aVar1 = field->data_;
    (__position._M_current)->number_ = field->number_;
    (__position._M_current)->type_ = uVar2;
    (__position._M_current)->data_ = aVar1;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
  }
  UnknownField::DeepCopy
            ((this->fields_->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1,__position._M_current);
  return;
}

Assistant:

void UnknownFieldSet::AddField(const UnknownField& field) {
  if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
  fields_->push_back(field);
  fields_->back().DeepCopy(field);
}